

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyBuildItem(Scl_Tree_t *p,char **ppPos,char *pEnd)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  Scl_Pair_t SVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  Scl_Item_t *pSVar15;
  byte *pbVar16;
  byte *pbVar17;
  ulong uVar18;
  byte *pbVar19;
  ulong uVar20;
  
  do {
    pbVar19 = (byte *)*ppPos;
    pbVar17 = pbVar19;
    if (pbVar19 < pEnd) {
      do {
        if (*pbVar19 == 10) {
          p->nLines = p->nLines + 1;
        }
        bVar1 = *pbVar19;
      } while (((((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
               (pbVar17 = pbVar19, bVar1 == 0x5c)) &&
              (pbVar19 = pbVar19 + 1, pbVar17 = (byte *)pEnd, pbVar19 != (byte *)pEnd));
    }
    *ppPos = (char *)pbVar17;
    if (pbVar17 == (byte *)pEnd) {
      return -2;
    }
    if (*pbVar17 == 0x22) {
      pbVar16 = pbVar17 + 1;
      do {
        pbVar19 = pbVar16;
        if (pEnd <= pbVar16) break;
        pbVar19 = pbVar16 + 1;
        bVar1 = *pbVar16;
        pbVar16 = pbVar19;
      } while (bVar1 != 0x22);
    }
    else {
      pbVar19 = pbVar17;
      pbVar16 = pbVar17;
      if (pbVar17 < pEnd) {
        while( true ) {
          bVar1 = *pbVar16;
          pbVar19 = pbVar16;
          if (((ulong)bVar1 < 0x3c) && ((0xc00030100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
          break;
          if ((bVar1 == 0x7b) ||
             ((bVar1 == 0x7d ||
              (pbVar16 = pbVar16 + 1, pbVar19 = (byte *)pEnd, pbVar16 == (byte *)pEnd)))) break;
        }
      }
    }
    uVar20 = (long)pbVar17 - (long)p->pContents;
    *ppPos = (char *)pbVar19;
    iVar6 = (int)uVar20;
    if (pbVar19 == (byte *)pEnd) {
      lVar14 = 0;
      goto LAB_003e3730;
    }
    pbVar17 = pbVar19;
    pbVar16 = pbVar19;
    if (pbVar19 < pEnd) {
      do {
        if (*pbVar16 == 10) {
          p->nLines = p->nLines + 1;
        }
        bVar1 = *pbVar16;
      } while (((((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
               (pbVar17 = pbVar16, bVar1 == 0x5c)) &&
              (pbVar16 = pbVar16 + 1, pbVar17 = (byte *)pEnd, pbVar16 != (byte *)pEnd));
    }
    lVar14 = (long)pbVar19 - (long)p->pContents;
    *ppPos = (char *)pbVar17;
    if (pbVar17 == (byte *)pEnd) goto LAB_003e3730;
    bVar1 = *pbVar17;
    if (bVar1 != 0x3b) break;
    *ppPos = (char *)(pbVar17 + 1);
  } while( true );
  iVar13 = (int)lVar14;
  if (bVar1 == 0x28) {
    pcVar10 = Scl_LibertyFindMatch((char *)pbVar17,pEnd);
    uVar18 = (ulong)(((int)pbVar17 - (int)p->pContents) + 1);
    lVar7 = (long)pcVar10 - (long)p->pContents;
    *ppPos = pcVar10 + 1;
    iVar5 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar5 != 0) {
      iVar5 = p->nItems;
      pSVar15 = p->pItems + iVar5;
      pSVar15->iLine = p->nLines;
      pSVar15->Type = 3;
      pSVar15->Next = -1;
      pSVar15->Child = -1;
      p->nItems = iVar5 + 1;
      (pSVar15->Key).Beg = iVar6;
      (pSVar15->Key).End = iVar13;
      SVar11 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)(uVar18 | lVar7 << 0x20));
      pSVar15->Head = SVar11;
      return (int)((ulong)((long)pSVar15 - (long)p->pItems) >> 3) * -0x33333333;
    }
    pcVar10 = *ppPos;
    if (*pcVar10 == ';') {
      *ppPos = pcVar10 + 1;
    }
    else if (*pcVar10 == '{') {
      pcVar8 = Scl_LibertyFindMatch(pcVar10,pEnd);
      iVar5 = *(int *)&p->pContents;
      pSVar15 = p->pItems;
      iVar4 = p->nItems;
      lVar12 = (long)iVar4;
      pSVar15[lVar12].iLine = p->nLines;
      pSVar15[lVar12].Type = 1;
      pSVar15[lVar12].Next = -1;
      pSVar15[lVar12].Child = -1;
      p->nItems = iVar4 + 1;
      pSVar15[lVar12].Key.Beg = iVar6;
      pSVar15[lVar12].Key.End = iVar13;
      SVar11 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)(uVar18 | lVar7 << 0x20));
      pSVar15[lVar12].Head = SVar11;
      pSVar15[lVar12].Body.Beg = ((int)pcVar10 - iVar5) + 1;
      pSVar15[lVar12].Body.End = (int)pcVar8 - iVar5;
      *ppPos = pcVar10 + 1;
      iVar6 = Scl_LibertyBuildItem(p,ppPos,pcVar8);
      pSVar15[lVar12].Child = iVar6;
      if (iVar6 != -1) {
        *ppPos = pcVar8 + 1;
        iVar6 = Scl_LibertyBuildItem(p,ppPos,pEnd);
        pSVar15[lVar12].Next = iVar6;
        if (iVar6 != -1) {
          return (int)((ulong)((long)pSVar15 + (lVar12 * 0x28 - (long)p->pItems)) >> 3) *
                 -0x33333333;
        }
      }
      goto LAB_003e3730;
    }
    pSVar15 = p->pItems;
    iVar5 = p->nItems;
    lVar12 = (long)iVar5;
    pSVar15[lVar12].iLine = p->nLines;
    pSVar15[lVar12].Type = 3;
  }
  else {
    if (bVar1 != 0x3a) goto LAB_003e3730;
    *ppPos = (char *)(pbVar17 + 1);
    iVar5 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar5 != 0) goto LAB_003e3730;
    uVar18 = (long)*ppPos - (long)p->pContents;
    iVar5 = Scl_LibertySkipEntry(ppPos,pEnd);
    if (iVar5 != 0) goto LAB_003e3730;
    lVar7 = (long)*ppPos - (long)p->pContents;
    iVar5 = Scl_LibertySkipSpaces(p,ppPos,pEnd,1);
    if (iVar5 != 0) goto LAB_003e3730;
    cVar2 = **ppPos;
    if ((cVar2 != ';') && (cVar2 != '\n')) goto LAB_003e3730;
    *ppPos = *ppPos + 1;
    pSVar15 = p->pItems;
    iVar5 = p->nItems;
    lVar12 = (long)iVar5;
    pSVar15[lVar12].iLine = p->nLines;
    pSVar15[lVar12].Type = 2;
  }
  pSVar15[lVar12].Next = -1;
  pSVar15[lVar12].Child = -1;
  p->nItems = iVar5 + 1;
  pSVar15[lVar12].Key.Beg = iVar6;
  pSVar15[lVar12].Key.End = iVar13;
  SVar11 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)(uVar18 & 0xffffffff | lVar7 << 0x20));
  pSVar15[lVar12].Head = SVar11;
  iVar6 = Scl_LibertyBuildItem(p,ppPos,pEnd);
  pSVar15[lVar12].Next = iVar6;
  if (iVar6 != -1) {
    return (int)((ulong)((long)pSVar15 + (lVar12 * 0x28 - (long)p->pItems)) >> 3) * -0x33333333;
  }
LAB_003e3730:
  if (p->pError == (char *)0x0) {
    pcVar8 = (char *)malloc(1000);
    p->pError = pcVar8;
    pcVar10 = p->pFileName;
    uVar3 = p->nLines;
    pcVar9 = Scl_LibertyReadString(p,(Scl_Pair_t)(uVar20 & 0xffffffff | lVar14 << 0x20));
    sprintf(pcVar8,"File \"%s\". Line %6d. Failed to parse entry \"%s\".\n",pcVar10,(ulong)uVar3,
            pcVar9);
  }
  return -1;
}

Assistant:

int Scl_LibertyBuildItem( Scl_Tree_t * p, char ** ppPos, char * pEnd )
{
    Scl_Item_t * pItem;
    Scl_Pair_t Key, Head, Body;
    char * pNext, * pStop;
    Key.End = 0;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        return -2;
    Key.Beg = *ppPos - p->pContents;
    if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
        goto exit;
    Key.End = *ppPos - p->pContents;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        goto exit;
    pNext = *ppPos;
    if ( *pNext == ':' )
    {
        *ppPos = pNext + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
            goto exit;
        Head.Beg = *ppPos - p->pContents;
        if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
            goto exit;
        Head.End = *ppPos - p->pContents;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 1 ) )
            goto exit;
        pNext = *ppPos;
        if ( *pNext != ';' && *pNext != '\n' )
            goto exit;
        *ppPos = pNext + 1;
        // end of equation
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_EQUA );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == '(' )
    {
        pStop = Scl_LibertyFindMatch( pNext, pEnd );
        Head.Beg = pNext - p->pContents + 1;
        Head.End = pStop - p->pContents;
        *ppPos = pStop + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        {
            // end of list
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            return Scl_LibertyItemId( p, pItem );
        }
        pNext = *ppPos;
        if ( *pNext == '{' ) // beginning of body
        {
            pStop = Scl_LibertyFindMatch( pNext, pEnd );
            Body.Beg = pNext - p->pContents + 1;
            Body.End = pStop - p->pContents;
            // end of body
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_PROC );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            pItem->Body = Body;
            *ppPos = pNext + 1;
            pItem->Child = Scl_LibertyBuildItem( p, ppPos, pStop );
            if ( pItem->Child == -1 )
                goto exit;
            *ppPos = pStop + 1;
            pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
            if ( pItem->Next == -1 )
                goto exit;
            return Scl_LibertyItemId( p, pItem );
        }
        // end of list
        if ( *pNext == ';' )
            *ppPos = pNext + 1;
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == ';' )
    {
        *ppPos = pNext + 1;
        return Scl_LibertyBuildItem(p, ppPos, pEnd);
    }
exit:
    if ( p->pError == NULL )
    {
        p->pError = ABC_ALLOC( char, 1000 );
        sprintf( p->pError, "File \"%s\". Line %6d. Failed to parse entry \"%s\".\n", 
            p->pFileName, p->nLines, Scl_LibertyReadString(p, Key) );
    }
    return -1;
}